

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separable_info.c
# Opt level: O1

double inform_separable_info
                 (int *srcs,int *dest,size_t l,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  int *src;
  bool bVar4;
  double dVar5;
  double local_58;
  
  if (l == 0) {
    dVar5 = NAN;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOSOURCES;
    }
  }
  else {
    local_58 = inform_active_info(dest,n,m,b,k,err);
    _Var2 = inform_failed(err);
    dVar5 = NAN;
    if (!_Var2) {
      dVar5 = inform_transfer_entropy(srcs,dest,(int *)0x0,0,n,m,b,k,err);
      local_58 = local_58 + dVar5;
      _Var2 = inform_failed(err);
      bVar4 = true;
      if (!_Var2) {
        src = srcs + m * n;
        uVar1 = 1;
        do {
          uVar3 = uVar1;
          if (l == uVar3) break;
          dVar5 = inform_transfer_entropy(src,dest,(int *)0x0,0,n,m,b,k,err);
          local_58 = local_58 + dVar5;
          _Var2 = inform_failed(err);
          src = src + m * n;
          uVar1 = uVar3 + 1;
        } while (!_Var2);
        bVar4 = uVar3 < l;
      }
      dVar5 = NAN;
      if (!bVar4) {
        dVar5 = local_58;
      }
    }
  }
  return dVar5;
}

Assistant:

double inform_separable_info(int const *srcs, int const *dest, size_t l,
    size_t n, size_t m, int b, size_t k, inform_error *err)
{
    if (l < 1) INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, NAN);

    double si = inform_active_info(dest, n, m, b, k, err);
    if (inform_failed(err)) return NAN;

    for (size_t i = 0; i < l; ++i, srcs += n*m)
    {
        si += inform_transfer_entropy(srcs, dest, NULL, 0, n, m, b, k, err);
        if (inform_failed(err)) return NAN;
    }

    return si;
}